

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_reflect_set(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int *piVar1;
  JSValue this_obj;
  JSValue val;
  JSAtom prop;
  int iVar2;
  JSValueUnion JVar3;
  int64_t iVar4;
  JSValue JVar5;
  JSValueUnion local_48;
  int64_t iStack_40;
  
  local_48 = (JSValueUnion)(argv->u).ptr;
  JVar5 = *argv;
  iStack_40 = argv->tag;
  if (3 < argc) {
    local_48 = (JSValueUnion)argv[3].u.ptr;
    iStack_40 = argv[3].tag;
  }
  if ((int)argv->tag == -1) {
    piVar1 = (int *)argv[2].u.ptr;
    iVar4 = argv[2].tag;
    val = argv[2];
    prop = JS_ValueToAtom(ctx,argv[1]);
    if (prop != 0) {
      if (0xfffffff4 < (uint)iVar4) {
        *piVar1 = *piVar1 + 1;
      }
      this_obj.tag = iStack_40;
      this_obj.u.float64 = local_48.float64;
      iVar2 = JS_SetPropertyGeneric(ctx,JVar5,prop,val,this_obj,0);
      JS_FreeAtom(ctx,prop);
      if (-1 < iVar2) {
        JVar3._1_7_ = 0;
        JVar3.int32._0_1_ = iVar2 != 0;
        iVar4 = 1;
        goto LAB_00159d42;
      }
    }
  }
  else {
    JS_ThrowTypeErrorNotAnObject(ctx);
  }
  iVar4 = 6;
  JVar3.float64 = 0.0;
LAB_00159d42:
  JVar5.tag = iVar4;
  JVar5.u.float64 = JVar3.float64;
  return JVar5;
}

Assistant:

static JSValue js_reflect_set(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv)
{
    JSValueConst obj, prop, val, receiver;
    int ret;
    JSAtom atom;

    obj = argv[0];
    prop = argv[1];
    val = argv[2];
    if (argc > 3)
        receiver = argv[3];
    else
        receiver = obj;
    if (JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT)
        return JS_ThrowTypeErrorNotAnObject(ctx);
    atom = JS_ValueToAtom(ctx, prop);
    if (unlikely(atom == JS_ATOM_NULL))
        return JS_EXCEPTION;
    ret = JS_SetPropertyGeneric(ctx, obj, atom,
                                JS_DupValue(ctx, val), receiver, 0);
    JS_FreeAtom(ctx, atom);
    if (ret < 0)
        return JS_EXCEPTION;
    else
        return JS_NewBool(ctx, ret);
}